

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metablock.c
# Opt level: O1

void BrotliBuildMetaBlock
               (MemoryManager *m,uint8_t *ringbuffer,size_t pos,size_t mask,
               BrotliEncoderParams *params,uint8_t prev_byte,uint8_t prev_byte2,
               Command_conflict *cmds,size_t num_commands,ContextType literal_context_mode,
               BlockSplitFromDecoder *literals_block_splits_decoder,size_t *current_block_literals,
               BlockSplitFromDecoder *cmds_block_splits_decoder,size_t *current_block_cmds,
               MetaBlockSplit *mb)

{
  ulong uVar1;
  BlockSplit *dist_split;
  BrotliDistanceParams *orig_params_00;
  uint32_t uVar2;
  int iVar3;
  ContextType *context_modes;
  HistogramDistance *copy_dist_histograms;
  HistogramCommand *__s;
  size_t sVar4;
  uint32_t *puVar5;
  HistogramLiteral *pHVar6;
  HistogramDistance *pHVar7;
  byte bVar8;
  uint32_t *puVar9;
  uint32_t uVar10;
  ulong uVar11;
  long lVar12;
  size_t sVar13;
  uint16_t *puVar14;
  uint32_t ndirect;
  size_t sVar15;
  uint32_t npostfix;
  uint uVar16;
  bool bVar17;
  bool bVar18;
  HistogramLiteral *local_1e0;
  double local_1d0;
  double dist_cost;
  size_t *local_178;
  BlockSplitFromDecoder *local_170;
  size_t *local_168;
  BlockSplitFromDecoder *local_160;
  BrotliDistanceParams *local_158;
  BrotliEncoderParams orig_params;
  BrotliEncoderParams new_params;
  
  local_178 = current_block_cmds;
  local_170 = cmds_block_splits_decoder;
  local_168 = current_block_literals;
  local_160 = literals_block_splits_decoder;
  memcpy(&orig_params,params,0x90);
  memcpy(&new_params,params,0x90);
  uVar2 = orig_params.dist.num_direct_distance_codes;
  uVar10 = orig_params.dist.distance_postfix_bits;
  orig_params_00 = &orig_params.dist;
  local_158 = &params->dist;
  uVar16 = 0;
  bVar18 = true;
  local_1d0 = 1e+99;
  npostfix = 0;
  do {
    if (uVar16 < 0x10) {
      do {
        ndirect = uVar16 << ((byte)npostfix & 0x1f);
        BrotliInitDistanceParams(&new_params,npostfix,ndirect);
        bVar17 = false;
        if (ndirect == uVar2 && npostfix == uVar10) {
          bVar18 = bVar17;
        }
        iVar3 = ComputeDistanceCost(cmds,num_commands,orig_params_00,&new_params.dist,&dist_cost);
        if (iVar3 != 0) {
          if (dist_cost <= local_1d0) {
            local_158->max_distance = new_params.dist.max_distance;
            local_158->distance_postfix_bits = new_params.dist.distance_postfix_bits;
            local_158->num_direct_distance_codes = new_params.dist.num_direct_distance_codes;
            local_158->alphabet_size_max = new_params.dist.alphabet_size_max;
            local_158->alphabet_size_limit = new_params.dist.alphabet_size_limit;
            bVar17 = true;
            local_1d0 = dist_cost;
          }
          else {
            bVar17 = false;
          }
        }
        if (!bVar17) goto LAB_0010b822;
        uVar16 = uVar16 + 1;
      } while (uVar16 != 0x10);
      uVar16 = 0x10;
    }
LAB_0010b822:
    bVar17 = uVar16 == 0;
    uVar16 = uVar16 - 1 >> 1;
    if (bVar17) {
      uVar16 = 0;
    }
    npostfix = npostfix + 1;
  } while (npostfix != 4);
  if ((bVar18) &&
     (ComputeDistanceCost(cmds,num_commands,orig_params_00,orig_params_00,&dist_cost),
     dist_cost < local_1d0)) {
    (params->dist).max_distance = orig_params.dist.max_distance;
    (params->dist).distance_postfix_bits = orig_params.dist.distance_postfix_bits;
    (params->dist).num_direct_distance_codes = orig_params.dist.num_direct_distance_codes;
    (params->dist).alphabet_size_max = orig_params.dist.alphabet_size_max;
    (params->dist).alphabet_size_limit = orig_params.dist.alphabet_size_limit;
  }
  if (orig_params.dist.distance_postfix_bits == (params->dist).distance_postfix_bits) {
    if ((num_commands == 0) ||
       (orig_params.dist.num_direct_distance_codes == (params->dist).num_direct_distance_codes))
    goto LAB_0010b9f4;
  }
  else if (num_commands == 0) goto LAB_0010b9f4;
  lVar12 = num_commands + (num_commands == 0);
  puVar14 = &cmds->dist_prefix_;
  do {
    if (((*(uint *)(puVar14 + -5) & 0x1ffffff) != 0) && (0x7f < puVar14[-1])) {
      uVar16 = *puVar14 & 0x3ff;
      if (orig_params.dist.num_direct_distance_codes + 0x10 <= uVar16) {
        uVar16 = (uVar16 - orig_params.dist.num_direct_distance_codes) - 0x10;
        uVar16 = (uVar16 & ~(-1 << ((byte)orig_params.dist.distance_postfix_bits & 0x1f))) +
                 orig_params.dist.num_direct_distance_codes + 0x10 +
                 ((((uVar16 >> (orig_params.dist.distance_postfix_bits & 0x1f) & 1) != 0) + 2 <<
                  ((byte)(*puVar14 >> 10) & 0x1f)) + *(uint32_t *)(puVar14 + -3) + -4 <<
                 ((byte)orig_params.dist.distance_postfix_bits & 0x1f));
      }
      uVar11 = (ulong)(params->dist).num_direct_distance_codes;
      uVar1 = uVar11 + 0x10;
      if (uVar16 < uVar1) {
        *puVar14 = (ushort)uVar16;
        uVar10 = 0;
      }
      else {
        uVar10 = (params->dist).distance_postfix_bits;
        bVar8 = (byte)uVar10;
        uVar11 = ((uVar16 - uVar11) + (4L << (bVar8 & 0x3f))) - 0x10;
        uVar16 = 0x1f;
        if ((uint)uVar11 != 0) {
          for (; (uint)uVar11 >> uVar16 == 0; uVar16 = uVar16 - 1) {
          }
        }
        uVar16 = (uVar16 ^ 0xffffffe0) + 0x1f;
        bVar18 = (uVar11 >> ((ulong)uVar16 & 0x3f) & 1) != 0;
        iVar3 = uVar16 - uVar10;
        *puVar14 = (short)((uint)bVar18 + iVar3 * 2 + 0xfffe << (bVar8 & 0x3f)) +
                   (short)uVar1 + (~(ushort)(-1 << (bVar8 & 0x1f)) & (ushort)uVar11) |
                   (short)iVar3 * 0x400;
        uVar10 = (uint32_t)(uVar11 - ((ulong)bVar18 + 2 << ((byte)uVar16 & 0x3f)) >> (bVar8 & 0x3f))
        ;
      }
      *(uint32_t *)(puVar14 + -3) = uVar10;
    }
    puVar14 = puVar14 + 8;
    lVar12 = lVar12 + -1;
  } while (lVar12 != 0);
LAB_0010b9f4:
  dist_split = &mb->distance_split;
  BrotliSplitBlock(m,cmds,num_commands,ringbuffer,pos,mask,params,&mb->literal_split,
                   &mb->command_split,dist_split,local_160,local_168,local_170,local_178);
  if (params->disable_literal_context_modeling == 0) {
    sVar13 = (mb->literal_split).num_types;
    if (sVar13 == 0) {
      context_modes = (ContextType *)0x0;
    }
    else {
      context_modes = (ContextType *)BrotliAllocate(m,sVar13 << 2);
    }
    sVar13 = (mb->literal_split).num_types;
    lVar12 = 0x40;
    if (sVar13 != 0) {
      sVar15 = 0;
      do {
        context_modes[sVar15] = literal_context_mode;
        sVar15 = sVar15 + 1;
      } while (sVar13 != sVar15);
    }
  }
  else {
    lVar12 = 1;
    context_modes = (ContextType *)0x0;
  }
  sVar13 = lVar12 * (mb->literal_split).num_types;
  if (sVar13 == 0) {
    local_1e0 = (HistogramLiteral *)0x0;
  }
  else {
    local_1e0 = (HistogramLiteral *)BrotliAllocate(m,sVar13 * 0x410);
    sVar15 = sVar13;
    pHVar6 = local_1e0;
    do {
      memset(pHVar6,0,0x408);
      pHVar6->bit_cost_ = INFINITY;
      pHVar6 = pHVar6 + 1;
      sVar15 = sVar15 - 1;
    } while (sVar15 != 0);
  }
  lVar12 = dist_split->num_types * 4;
  if (lVar12 == 0) {
    copy_dist_histograms = (HistogramDistance *)0x0;
  }
  else {
    copy_dist_histograms = (HistogramDistance *)BrotliAllocate(m,dist_split->num_types * 0x2240);
    pHVar7 = copy_dist_histograms;
    do {
      memset(pHVar7,0,0x888);
      pHVar7->bit_cost_ = INFINITY;
      pHVar7 = pHVar7 + 1;
      lVar12 = lVar12 + -1;
    } while (lVar12 != 0);
  }
  sVar15 = (mb->command_split).num_types;
  mb->command_histograms_size = sVar15;
  if (sVar15 == 0) {
    __s = (HistogramCommand *)0x0;
  }
  else {
    __s = (HistogramCommand *)BrotliAllocate(m,sVar15 * 0xb10);
  }
  mb->command_histograms = __s;
  for (sVar15 = mb->command_histograms_size; sVar15 != 0; sVar15 = sVar15 - 1) {
    memset(__s,0,0xb08);
    __s->bit_cost_ = INFINITY;
    __s = __s + 1;
  }
  BrotliBuildHistogramsWithContext
            (cmds,num_commands,&mb->literal_split,&mb->command_split,dist_split,ringbuffer,pos,mask,
             prev_byte,prev_byte2,context_modes,local_1e0,mb->command_histograms,
             copy_dist_histograms);
  BrotliFree(m,context_modes);
  sVar15 = (mb->literal_split).num_types;
  sVar4 = sVar15 << 6;
  mb->literal_context_map_size = sVar4;
  if (sVar4 == 0) {
    puVar5 = (uint32_t *)0x0;
  }
  else {
    puVar5 = (uint32_t *)BrotliAllocate(m,sVar15 << 8);
  }
  mb->literal_context_map = puVar5;
  sVar15 = mb->literal_context_map_size;
  mb->literal_histograms_size = sVar15;
  if (sVar15 == 0) {
    pHVar6 = (HistogramLiteral *)0x0;
  }
  else {
    pHVar6 = (HistogramLiteral *)BrotliAllocate(m,sVar15 * 0x410);
  }
  mb->literal_histograms = pHVar6;
  BrotliClusterHistogramsLiteral
            (m,local_1e0,sVar13,0x100,pHVar6,&mb->literal_histograms_size,mb->literal_context_map);
  BrotliFree(m,local_1e0);
  if ((params->disable_literal_context_modeling != 0) &&
     (sVar13 = (mb->literal_split).num_types, sVar13 != 0)) {
    puVar5 = mb->literal_context_map;
    puVar9 = puVar5 + sVar13 * 0x40;
    do {
      sVar13 = sVar13 - 1;
      lVar12 = -0x40;
      do {
        puVar9[lVar12] = puVar5[sVar13];
        lVar12 = lVar12 + 1;
      } while (lVar12 != 0);
      puVar9 = puVar9 + -0x40;
    } while (sVar13 != 0);
  }
  sVar15 = (mb->distance_split).num_types;
  sVar13 = sVar15 * 4;
  mb->distance_context_map_size = sVar13;
  if (sVar13 == 0) {
    puVar5 = (uint32_t *)0x0;
  }
  else {
    puVar5 = (uint32_t *)BrotliAllocate(m,sVar15 << 4);
  }
  mb->distance_context_map = puVar5;
  sVar13 = mb->distance_context_map_size;
  mb->distance_histograms_size = sVar13;
  if (sVar13 == 0) {
    pHVar7 = (HistogramDistance *)0x0;
  }
  else {
    pHVar7 = (HistogramDistance *)BrotliAllocate(m,sVar13 * 0x890);
  }
  mb->distance_histograms = pHVar7;
  BrotliClusterHistogramsDistance
            (m,copy_dist_histograms,mb->distance_context_map_size,0x100,pHVar7,
             &mb->distance_histograms_size,mb->distance_context_map);
  BrotliFree(m,copy_dist_histograms);
  return;
}

Assistant:

void BrotliBuildMetaBlock(MemoryManager* m,
                      const uint8_t* ringbuffer,
                      const size_t pos,
                      const size_t mask,
                      BrotliEncoderParams* params,
                      uint8_t prev_byte,
                      uint8_t prev_byte2,
                      Command* cmds,
                      size_t num_commands,
                      ContextType literal_context_mode,
                      const BlockSplitFromDecoder* literals_block_splits_decoder,
                      size_t* current_block_literals,
                      const BlockSplitFromDecoder* cmds_block_splits_decoder,
                      size_t* current_block_cmds,
                      MetaBlockSplit* mb) {
  static const size_t kMaxNumberOfHistograms = 256;
  HistogramDistance* distance_histograms;
  HistogramLiteral* literal_histograms;
  ContextType* literal_context_modes = NULL;
  size_t literal_histograms_size;
  size_t distance_histograms_size;
  size_t i;
  size_t literal_context_multiplier = 1;
  uint32_t npostfix;
  uint32_t ndirect_msb = 0;
  BROTLI_BOOL check_orig = BROTLI_TRUE;
  double best_dist_cost = 1e99;
  BrotliEncoderParams orig_params = *params;
  BrotliEncoderParams new_params = *params;

  for (npostfix = 0; npostfix <= BROTLI_MAX_NPOSTFIX; npostfix++) {
    for (; ndirect_msb < 16; ndirect_msb++) {
      uint32_t ndirect = ndirect_msb << npostfix;
      BROTLI_BOOL skip;
      double dist_cost;
      BrotliInitDistanceParams(&new_params, npostfix, ndirect);
      if (npostfix == orig_params.dist.distance_postfix_bits &&
          ndirect == orig_params.dist.num_direct_distance_codes) {
        check_orig = BROTLI_FALSE;
      }
      skip = !ComputeDistanceCost(
          cmds, num_commands,
          &orig_params.dist, &new_params.dist, &dist_cost);
      if (skip || (dist_cost > best_dist_cost)) {
        break;
      }
      best_dist_cost = dist_cost;
      params->dist = new_params.dist;
    }
    if (ndirect_msb > 0) ndirect_msb--;
    ndirect_msb /= 2;
  }
  if (check_orig) {
    double dist_cost;
    ComputeDistanceCost(cmds, num_commands,
                        &orig_params.dist, &orig_params.dist, &dist_cost);
    if (dist_cost < best_dist_cost) {
      /* NB: currently unused; uncomment when more param tuning is added. */
      /* best_dist_cost = dist_cost; */
      params->dist = orig_params.dist;
    }
  }
  RecomputeDistancePrefixes(cmds, num_commands,
                            &orig_params.dist, &params->dist);
  BrotliSplitBlock(m, cmds, num_commands,
                   ringbuffer, pos, mask, params,
                   &mb->literal_split,
                   &mb->command_split,
                   &mb->distance_split,
                   literals_block_splits_decoder, current_block_literals,
                   cmds_block_splits_decoder, current_block_cmds);

  if (BROTLI_IS_OOM(m)) return;
  if (!params->disable_literal_context_modeling) {
    literal_context_multiplier = 1 << BROTLI_LITERAL_CONTEXT_BITS;
    literal_context_modes =
        BROTLI_ALLOC(m, ContextType, mb->literal_split.num_types);
    if (BROTLI_IS_OOM(m) || BROTLI_IS_NULL(literal_context_modes)) return;
    for (i = 0; i < mb->literal_split.num_types; ++i) {
      literal_context_modes[i] = literal_context_mode;
    }
  }
  literal_histograms_size =
      mb->literal_split.num_types * literal_context_multiplier;
  literal_histograms =
      BROTLI_ALLOC(m, HistogramLiteral, literal_histograms_size);
  if (BROTLI_IS_OOM(m) || BROTLI_IS_NULL(literal_histograms)) return;
  ClearHistogramsLiteral(literal_histograms, literal_histograms_size);

  distance_histograms_size =
      mb->distance_split.num_types << BROTLI_DISTANCE_CONTEXT_BITS;
  distance_histograms =
      BROTLI_ALLOC(m, HistogramDistance, distance_histograms_size);
  if (BROTLI_IS_OOM(m) || BROTLI_IS_NULL(distance_histograms)) return;
  ClearHistogramsDistance(distance_histograms, distance_histograms_size);
  BROTLI_DCHECK(mb->command_histograms == 0);
  mb->command_histograms_size = mb->command_split.num_types;
  mb->command_histograms =
      BROTLI_ALLOC(m, HistogramCommand, mb->command_histograms_size);
  if (BROTLI_IS_OOM(m) || BROTLI_IS_NULL(mb->command_histograms)) return;
  ClearHistogramsCommand(mb->command_histograms, mb->command_histograms_size);
  BrotliBuildHistogramsWithContext(cmds, num_commands,
      &mb->literal_split, &mb->command_split, &mb->distance_split,
      ringbuffer, pos, mask, prev_byte, prev_byte2, literal_context_modes,
      literal_histograms, mb->command_histograms, distance_histograms);
  BROTLI_FREE(m, literal_context_modes);
  BROTLI_DCHECK(mb->literal_context_map == 0);
  mb->literal_context_map_size =
      mb->literal_split.num_types << BROTLI_LITERAL_CONTEXT_BITS;
  mb->literal_context_map =
      BROTLI_ALLOC(m, uint32_t, mb->literal_context_map_size);
  if (BROTLI_IS_OOM(m) || BROTLI_IS_NULL(mb->literal_context_map)) return;

  BROTLI_DCHECK(mb->literal_histograms == 0);
  mb->literal_histograms_size = mb->literal_context_map_size;
  mb->literal_histograms =
      BROTLI_ALLOC(m, HistogramLiteral, mb->literal_histograms_size);
  if (BROTLI_IS_OOM(m) || BROTLI_IS_NULL(mb->literal_histograms)) return;

  BrotliClusterHistogramsLiteral(m, literal_histograms, literal_histograms_size,
      kMaxNumberOfHistograms, mb->literal_histograms,
      &mb->literal_histograms_size, mb->literal_context_map);

  if (BROTLI_IS_OOM(m)) return;
  BROTLI_FREE(m, literal_histograms);

  if (params->disable_literal_context_modeling) {
    /* Distribute assignment to all contexts. */
    for (i = mb->literal_split.num_types; i != 0;) {
      size_t j = 0;
      i--;
      for (; j < (1 << BROTLI_LITERAL_CONTEXT_BITS); j++) {
        mb->literal_context_map[(i << BROTLI_LITERAL_CONTEXT_BITS) + j] =
            mb->literal_context_map[i];
      }
    }
  }
  BROTLI_DCHECK(mb->distance_context_map == 0);
  mb->distance_context_map_size =
      mb->distance_split.num_types << BROTLI_DISTANCE_CONTEXT_BITS;
  mb->distance_context_map =
      BROTLI_ALLOC(m, uint32_t, mb->distance_context_map_size);
  if (BROTLI_IS_OOM(m) || BROTLI_IS_NULL(mb->distance_context_map)) return;

  BROTLI_DCHECK(mb->distance_histograms == 0);
  mb->distance_histograms_size = mb->distance_context_map_size;
  mb->distance_histograms =
      BROTLI_ALLOC(m, HistogramDistance, mb->distance_histograms_size);
  if (BROTLI_IS_OOM(m) || BROTLI_IS_NULL(mb->distance_histograms)) return;

  BrotliClusterHistogramsDistance(m, distance_histograms,
                                  mb->distance_context_map_size,
                                  kMaxNumberOfHistograms,
                                  mb->distance_histograms,
                                  &mb->distance_histograms_size,
                                  mb->distance_context_map);
  if (BROTLI_IS_OOM(m)) return;
  BROTLI_FREE(m, distance_histograms);
}